

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

ExecutionResult __thiscall nigel::Lexer::onExecute(Lexer *this,CodeBase *base)

{
  size_t *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  _List_node_base *p_Var6;
  pointer pLVar7;
  undefined7 extraout_var;
  uint uVar9;
  pointer pLVar10;
  ulong uVar11;
  undefined8 extraout_RDX;
  char *str;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  Lexer *this_01;
  byte c;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  String tmpStr;
  undefined1 local_111;
  uint local_110;
  uint local_10c;
  undefined1 local_108 [48];
  element_type *local_d8;
  Lexer *pLStack_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined4 local_b4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined1 local_a8 [32];
  element_type *local_88;
  Lexer *pLStack_80;
  element_type *local_78;
  Lexer *pLStack_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_48;
  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  Lexer *local_38;
  ulong uVar8;
  
  local_108._0_8_ = local_108 + 0x10;
  local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108[0x10] = '\0';
  this->currLineNo = 1;
  this->currColumnNo = 0;
  str = (char *)(base->fileCont).
                super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                ._M_impl.super__Vector_impl_data._M_start;
  this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if ((pointer)str !=
      (base->fileCont).
      super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (this->currLine).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (((pointer)str)->content).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->currLine).
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(((pointer)str)->content).
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    pLVar7 = (base->fileCont).
             super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->currPath).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (pLVar7->path).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    this_00._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         &(this->currPath).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
    str = (char *)&(pLVar7->path).
                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00._M_pi,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)str);
  }
  local_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&base->lexerStruct;
  local_48 = &(this->currLine).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
  local_50._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       &(this->currPath).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  local_108._44_4_ = 0;
  local_110 = 0;
  bVar3 = false;
  local_10c = 0;
  local_108._32_8_ = 0;
  uVar13 = 0;
  do {
    pLVar7 = (base->fileCont).
             super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar10 = (base->fileCont).
              super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    str = (char *)CONCAT71((int7)((ulong)str >> 8),1);
    local_b4 = SUB84(str,0);
    if (uVar13 < (ulong)(((long)pLVar10 - (long)pLVar7 >> 3) * -0x3333333333333333)) {
      lVar12 = uVar13 * 0x28 + 0x48;
      do {
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->currColumnNo;
        str = *(char **)((long)pLVar7 + lVar12 + -0x48);
        if (p_Var2 < (((pointer)str)->content).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi) {
          this->currColumnNo = (size_t)((long)&p_Var2->_vptr__Sp_counted_base + 1);
          c = *(byte *)((long)&p_Var2->_vptr__Sp_counted_base +
                       (long)(((pointer)str)->content).
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
          local_b4 = 0;
          goto LAB_00161e5f;
        }
        if (bVar3) {
          std::__shared_ptr<nigel::Token_Comment,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token_Comment>,std::__cxx11::string&>
                    ((__shared_ptr<nigel::Token_Comment,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
                     (allocator<nigel::Token_Comment> *)&local_111,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
          ;
          local_68 = local_d8;
          _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_d0;
          local_d8 = (element_type *)0x0;
          pLStack_d0 = (Lexer *)0x0;
          makeToken((Lexer *)local_a8,(shared_ptr<nigel::Token> *)this);
          p_Var6 = (_List_node_base *)operator_new(0x20);
          p_Var6[1]._M_next = (_List_node_base *)local_a8._0_8_;
          p_Var6[1]._M_prev = (_List_node_base *)local_a8._8_8_;
          str = (char *)local_c0._M_pi;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &(base->lexerStruct).
                    super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if ((Lexer *)_Stack_60._M_pi != (Lexer *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
          }
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_d0;
          if (pLStack_d0 != (Lexer *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_d0);
          }
          local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(char *)local_108._0_8_ = '\0';
          pLVar7 = (base->fileCont).
                   super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pLVar10 = (base->fileCont).
                    super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          bVar3 = false;
        }
        this->currColumnNo = 0;
        uVar13 = uVar13 + 1;
        uVar11 = ((long)pLVar10 - (long)pLVar7 >> 3) * -0x3333333333333333;
        if (uVar13 < uVar11) {
          psVar1 = (size_t *)
                   ((long)&(pLVar7->content).
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar12);
          this->currLineNo = *psVar1;
          (this->currLine).
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)psVar1[-4];
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (local_48,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(psVar1 + -3));
          pLVar7 = (base->fileCont).
                   super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          str = (char *)((long)pLVar7 + lVar12 + -8);
          (this->currPath).super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = *(element_type **)((long)pLVar7 + lVar12 + -0x10);
          this_00._M_pi = local_50._M_pi;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_50._M_pi,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)str);
          pLVar7 = (base->fileCont).
                   super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pLVar10 = (base->fileCont).
                    super__Vector_base<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          uVar11 = ((long)pLVar10 - (long)pLVar7 >> 3) * -0x3333333333333333;
        }
        lVar12 = lVar12 + 0x28;
      } while (uVar13 < uVar11);
    }
    c = 0;
LAB_00161e5f:
    local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)c;
    if (((local_10c & 1) == 0) || (local_108[0x20] != '\\' && c == 0x22)) {
      if (bVar3) {
        str = (char *)(ulong)(uint)(int)(char)c;
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108;
        std::__cxx11::string::push_back((char)this_00._M_pi);
      }
      else if ((local_110 & 1) == 0) {
        if ((c < 0x21) && ((0x100002601U >> ((ulong)local_b0._M_pi & 0x3f) & 1) != 0)) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            str = local_108;
            this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
            adoptToken(this,(String *)str,base);
          }
          this->previousColumnNo = this->previousColumnNo + 1;
        }
        else {
          local_110 = (uint)(char)c;
          bVar14 = isOperator((Lexer *)this_00._M_pi,c);
          if (bVar14) {
            if (c == 0x2a) {
              this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108;
              str = "/";
              iVar5 = std::__cxx11::string::compare((char *)this_00._M_pi);
              if (iVar5 == 0) {
                local_108._44_4_ = local_108._44_4_ + 1;
                local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                *(char *)local_108._0_8_ = '\0';
                local_110 = (uint)CONCAT71(SUB87(local_108._0_8_,1),1);
                goto switchD_001620b4_caseD_1;
              }
            }
            else if ((int)local_b0._M_pi == 0x2f) {
              this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108;
              str = "/";
              iVar5 = std::__cxx11::string::compare((char *)this_00._M_pi);
              if (iVar5 == 0) {
                local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                *(char *)local_108._0_8_ = '\0';
                bVar3 = true;
                goto LAB_0016202c;
              }
            }
            bVar14 = isOperator((Lexer *)this_00._M_pi,local_108[0x20]);
            if (!bVar14) {
LAB_00162247:
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0016224f:
                adoptToken(this,(String *)local_108,base);
              }
            }
          }
          else {
            if (9 < (byte)(c - 0x30)) {
              if (c == 0x78) {
                this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108;
                iVar5 = std::__cxx11::string::compare((char *)this_00._M_pi);
                if (iVar5 != 0) {
LAB_00162299:
                  bVar14 = isDividingToken((Lexer *)this_00._M_pi,(char)local_110);
                  if (bVar14) {
                    str = (char *)(ulong)(uint)(int)local_108[0x20];
                    bVar14 = isDividingToken((Lexer *)this_00._M_pi,local_108[0x20]);
                    if (!bVar14) {
                      if (c != 0x22) goto LAB_00162247;
                      if ((local_10c & 1) == 0) {
                        local_10c = (uint)CONCAT71(extraout_var,
                                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   local_108._8_8_ ==
                                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   0x0);
                      }
                      else {
                        std::__shared_ptr<nigel::Token_StringL,(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr<std::allocator<nigel::Token_StringL>,std::__cxx11::string&>
                                  ((__shared_ptr<nigel::Token_StringL,(__gnu_cxx::_Lock_policy)2> *)
                                   &local_d8,(allocator<nigel::Token_StringL> *)&local_111,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_108);
                        local_88 = local_d8;
                        pLStack_80 = pLStack_d0;
                        local_d8 = (element_type *)0x0;
                        pLStack_d0 = (Lexer *)0x0;
                        makeToken((Lexer *)local_a8,(shared_ptr<nigel::Token> *)this);
                        p_Var6 = (_List_node_base *)operator_new(0x20);
                        p_Var6[1]._M_next = (_List_node_base *)local_a8._0_8_;
                        p_Var6[1]._M_prev = (_List_node_base *)local_a8._8_8_;
                        str = (char *)local_c0._M_pi;
                        std::__detail::_List_node_base::_M_hook(p_Var6);
                        psVar1 = &(base->lexerStruct).
                                  super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                                  ._M_impl._M_node._M_size;
                        *psVar1 = *psVar1 + 1;
                        if (pLStack_80 != (Lexer *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_80);
                        }
                        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_d0;
                        if (pLStack_d0 != (Lexer *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_d0);
                        }
                        local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        *(char *)local_108._0_8_ = '\0';
                        local_10c = 0;
                      }
                      goto LAB_0016202c;
                    }
                  }
                  if ((local_108[0x20] != '\0') &&
                     (bVar14 = isIdentifier((Lexer *)this_00._M_pi,local_108[0x20]), !bVar14))
                  goto LAB_0016224f;
                  goto LAB_0016225f;
                }
              }
              else if ((((5 < (byte)((c & 0xdf) + 0xbf)) ||
                        ((ulong)local_108._8_8_ <
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2)) ||
                       (*(char *)local_108._0_8_ != '0')) || (*(char *)(local_108._0_8_ + 1) != 'x')
                      ) goto LAB_00162299;
            }
            if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               ((9 < (byte)((char)local_108._32_8_ - 0x30U) &&
                (bVar14 = isIdentifier((Lexer *)this_00._M_pi,*(char *)local_108._0_8_), !bVar14))))
            {
              std::__cxx11::string::substr((ulong)local_a8,(ulong)local_108);
              str = "0x";
              iVar5 = std::__cxx11::string::compare(local_a8);
              bVar14 = true;
              if (iVar5 != 0) {
                str = "-";
                iVar5 = std::__cxx11::string::compare(local_108);
                if (iVar5 != 0) {
                  str = "+";
                  iVar5 = std::__cxx11::string::compare(local_108);
                  if (iVar5 != 0) {
                    bVar14 = false;
                    goto LAB_001623c6;
                  }
                }
                if ((pointer)(((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&(local_c0._M_pi)->_vptr__Sp_counted_base)->
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr != (pointer)local_c0._M_pi) {
                  iVar5 = *(int *)&(base->lexerStruct).
                                   super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                                   ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next[1].
                                   _M_prev;
                  bVar14 = iVar5 == 0x3b || iVar5 == 0x18;
                }
              }
LAB_001623c6:
              this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_;
              if ((Lexer *)local_a8._0_8_ != (Lexer *)(local_a8 + 0x10)) {
                str = (char *)((long)(_List_node_base **)local_a8._16_8_ + 1);
                operator_delete((void *)local_a8._0_8_,(ulong)str);
              }
              if (!bVar14) {
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0016224f;
                goto LAB_0016202c;
              }
            }
          }
LAB_0016225f:
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108;
          str = (char *)(ulong)local_110;
          std::__cxx11::string::push_back((char)this_00._M_pi);
        }
LAB_0016202c:
        local_110 = 0;
      }
      else {
        str = (char *)(ulong)(uint)(int)(char)c;
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108;
        std::__cxx11::string::push_back((char)this_00._M_pi);
        local_110 = (uint)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
        iVar5 = local_108._44_4_;
        if ((c == 0x2f && (char)local_108._32_8_ == '*') &&
           (iVar5 = local_108._44_4_ + -1, local_108._44_4_ + -1 == 0)) {
          std::__cxx11::string::pop_back();
          std::__cxx11::string::pop_back();
          std::__shared_ptr<nigel::Token_Comment,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token_Comment>,std::__cxx11::string&>
                    ((__shared_ptr<nigel::Token_Comment,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
                     (allocator<nigel::Token_Comment> *)&local_111,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
          ;
          local_78 = local_d8;
          pLStack_70 = pLStack_d0;
          local_d8 = (element_type *)0x0;
          pLStack_d0 = (Lexer *)0x0;
          makeToken((Lexer *)local_a8,(shared_ptr<nigel::Token> *)this);
          p_Var6 = (_List_node_base *)operator_new(0x20);
          p_Var6[1]._M_next = (_List_node_base *)local_a8._0_8_;
          p_Var6[1]._M_prev = (_List_node_base *)local_a8._8_8_;
          str = (char *)local_c0._M_pi;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &(base->lexerStruct).
                    super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if (pLStack_70 != (Lexer *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_70);
          }
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_d0;
          if (pLStack_d0 != (Lexer *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_d0);
          }
          local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(char *)local_108._0_8_ = '\0';
          local_110 = 0;
          iVar5 = 0;
        }
        local_108._44_4_ = iVar5 + (uint)(c == 0x2a && (char)local_108._32_8_ == '/');
      }
    }
    else if (local_108[0x20] == '\\') {
      local_10c = 1;
      uVar9 = (uint)c;
      if (uVar9 < 0x62) {
        uVar11 = (ulong)(uVar9 - 0x22);
        if (0x3f < uVar9 - 0x22) goto switchD_001620b4_caseD_1;
        if ((0x400000020000021U >> (uVar11 & 0x3f) & 1) == 0) {
          if (uVar11 == 0xe) {
            c = 0;
          }
          else {
            if (uVar11 != 0x3f) goto switchD_001620b4_caseD_1;
            c = 0;
          }
        }
      }
      else {
        uVar4 = c - 0x6e;
        uVar8 = (ulong)uVar4;
        if (uVar4 < 9) {
          uVar11 = (long)&switchD_001620b4::switchdataD_00171560 +
                   (long)(int)(&switchD_001620b4::switchdataD_00171560)[uVar8];
          switch(uVar8) {
          case 0:
            c = 0;
            break;
          default:
            goto switchD_001620b4_caseD_1;
          case 4:
            c = 0;
            break;
          case 6:
            c = 0;
            break;
          case 8:
            c = 0;
          }
        }
        else {
          uVar11 = uVar8;
          if (uVar9 == 0x62) {
            c = 0;
          }
          else {
            if (c != 0x66) goto switchD_001620b4_caseD_1;
            c = 0;
          }
        }
      }
LAB_00162042:
      local_10c = (uint)CONCAT71((int7)(uVar11 >> 8),1);
      str = (char *)(ulong)(uint)(int)(char)c;
      this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108;
      std::__cxx11::string::push_back((char)this_00._M_pi);
    }
    else {
      uVar11 = 0;
      local_10c = 1;
      if (c != 0x5c) goto LAB_00162042;
    }
switchD_001620b4_caseD_1:
    bVar14 = local_108[0x20] == '\\';
    local_108._32_8_ = (ulong)local_b0._M_pi & 0xffffffff;
    if (bVar14) {
      local_108._32_8_ = 0;
    }
    if ((char)local_b4 != '\0') {
      local_d8 = (element_type *)CONCAT44(local_d8._4_4_,1);
      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                (local_40,(allocator<nigel::Token> *)&local_111,(Type *)&local_d8);
      makeToken((Lexer *)local_a8,(shared_ptr<nigel::Token> *)this);
      p_Var6 = (_List_node_base *)operator_new(0x20);
      p_Var6[1]._M_next = (_List_node_base *)local_a8._0_8_;
      p_Var6[1]._M_prev = (_List_node_base *)local_a8._8_8_;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar1 = &(base->lexerStruct).
                super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      this_01 = local_38;
      if (local_38 != (Lexer *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
        this_01 = local_38;
      }
      postLexer(this_01,base);
      if (base->printLexer == true) {
        printLexerStructure(this_01,base);
      }
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
      }
      return success;
    }
  } while( true );
}

Assistant:

ExecutionResult Lexer::onExecute( CodeBase &base )
	{
		size_t fileLine = 0;
		//size_t fileColumn = 0;

		u8 c, previousC = 0;
		String tmpStr;
		bool finish = false;
		currLineNo = 1;
		currColumnNo = 0;

		//Special values
		bool isString = false;//If is string literal
		bool isLineComment = false;//If is comment from // untile lineend
		bool isMultiComment = false;//If is multiline-comment with /* */
		int multiCommentCount = 0;//Enables nested comments
		if( !base.fileCont.empty() )
		{
			currLine = base.fileCont[0].content;
			currPath = base.fileCont[0].path;
		}

		while( !finish )
		{//Iterate whole file content
			while( fileLine < base.fileCont.size() && currColumnNo >= base.fileCont[fileLine].content->size() )
			{//Newline
				if( isLineComment )
				{
					base.lexerStruct.push_back( makeToken( std::make_shared<Token_Comment>( tmpStr ) ) );
					tmpStr.clear();
					isLineComment = false;
				}
				currColumnNo = 0;
				fileLine++;
				if( fileLine < base.fileCont.size() )
				{
					currLineNo = base.fileCont[fileLine].line;
					currLine = base.fileCont[fileLine].content;
					currPath = base.fileCont[fileLine].path;
				}
			}
			if( fileLine >= base.fileCont.size() )
			{
				finish = true;
				c = 0;
			}
			else c = base.fileCont[fileLine].content->at( currColumnNo++ );


			if( isString && ( c != '"' || previousC == '\\'  ) )
			{//Capture string literal
				if( previousC == '\\' )
				{
					if( c == '\\' ) tmpStr += '\\';//Backslash
					else if( c == 'n' ) tmpStr += '\n';//Newline
					else if( c == 'r' ) tmpStr += '\r';//Carriage return
					else if( c == 't' ) tmpStr += '\t';//Tabulator
					else if( c == 'v' ) tmpStr += '\v';//Vertical tabulator
					else if( c == 'b' ) tmpStr += '\b';//Backspace
					else if( c == 'f' ) tmpStr += '\f';//Form feed
					else if( c == 'a' ) tmpStr += '\a';//Alert
					else if( c == '?' ) tmpStr += '\?';//Question mark
					else if( c == '\'' ) tmpStr += '\'';//Single quote
					else if( c == '"' ) tmpStr += '\"';//Double quote
					else if( c == '0' ) tmpStr += '\0';//Null as value, not as character.
				}
				else if( c != '\\' ) tmpStr += c;
			}
			else if( isLineComment )
			{//Capture comment
				tmpStr += c;
			}
			else if( isMultiComment )
			{//Capture comment
				tmpStr += c;
				if( previousC == '*' && c == '/' )
				{//Comment finished
					multiCommentCount--;
					if( multiCommentCount == 0 )
					{
						tmpStr.pop_back();//Remove *
						tmpStr.pop_back();//Remove /

						base.lexerStruct.push_back( makeToken( std::make_shared<Token_Comment>( tmpStr ) ) );
						tmpStr.clear();
						isMultiComment = false;
					}
				}
				if( previousC == '/' && c == '*' ) multiCommentCount++;
			}


			else if( isWhitespace( c ) )
			{//Ignore and split token
				if( !tmpStr.empty() )
				{//Finish previous token
					adoptToken( tmpStr, base );
				}
				previousColumnNo++;
			}
			else if( isOperator( c ) )
			{
				if( c == '/' && tmpStr == "/" )
				{//Found comment with //
					isLineComment = true;
					tmpStr.clear();
				}
				else if( c == '*' && tmpStr == "/" )
				{//Found comment with /*
					isMultiComment = true;
					multiCommentCount++;
					tmpStr.clear();
				}

				else if( isOperator( previousC ) || tmpStr.empty() ) tmpStr += c;
				else if( !tmpStr.empty() )
				{//Finish previous token
					adoptToken( tmpStr, base );
					tmpStr += c;
				}
			}
			else if (isNumber(c) || (c == 'x' && tmpStr == "0") || ( isHexValue(c) && tmpStr.size() >=2 && tmpStr[0] == '0' && tmpStr[1] == 'x'))
			{
				if( tmpStr.empty() || isNumber( previousC ) || isIdentifier( tmpStr.front() ) || previousC == '0' || tmpStr.substr(0, 2) == "0x" ||
					( ( tmpStr == "-" || tmpStr == "+" ) && ( base.lexerStruct.empty() || base.lexerStruct.back()->type == Token::Type::operatorToken || base.lexerStruct.back()->type == Token::Type::dividingToken ) )
					) tmpStr += c;
				else if( !tmpStr.empty() )
				{//Finish previous token
					adoptToken( tmpStr, base );
					tmpStr += c;
				}
			}
			else if( isDividingToken( c ) && !isDividingToken( previousC ) )
			{
				if( c == '"' )
				{
					if( isString )
					{//Admit string
						base.lexerStruct.push_back( makeToken( std::make_shared<Token_StringL>( tmpStr ) ) );
						tmpStr.clear();
						isString = false;
					}
					else if( tmpStr.empty() ) isString = true;
				}
				else
				{
					if( isDividingToken( previousC ) || tmpStr.empty() ) tmpStr += c;
					else if( !tmpStr.empty() )
					{//Finish previous token
						adoptToken( tmpStr, base );
						tmpStr += c;
					}
				}
			}
			else
			{
				if( previousC == 0 || isIdentifier( previousC ) )
					tmpStr += c;
				else
				{//Finish previous token
					adoptToken( tmpStr, base );
					tmpStr += c;
				}
			}

			if( previousC != '\\' ) previousC = c;
			else previousC = 0;
		}
		base.lexerStruct.push_back( makeToken( std::make_shared<Token>( Token::Type::eof ) ) );

		postLexer( base );

		if( base.printLexer ) printLexerStructure( base );

		return ExecutionResult::success;
	}